

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::emplace_back<>
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this)

{
  size_type sVar1;
  reference pos;
  pointer pSVar2;
  
  sVar1 = this->len;
  pos = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    pSVar2 = emplaceRealloc<>(this,pos);
    return pSVar2;
  }
  (pos->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).data_ =
       (pointer)(pos->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).firstElement;
  (pos->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).len = 0;
  (pos->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).cap = 2;
  this->len = sVar1 + 1;
  return pos;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }